

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O3

void __thiscall
cmCommandArgumentParserHelper::AllocateParserType
          (cmCommandArgumentParserHelper *this,ParserType *pt,char *str,int len)

{
  size_t sVar1;
  tuple<char_*,_std::default_delete<char[]>_> __dest;
  pointer *__ptr;
  size_t __n;
  __uniq_ptr_impl<char,_std::default_delete<char[]>_> local_38;
  
  pt->str = (char *)0x0;
  if (len == 0) {
    sVar1 = strlen(str);
    len = (int)sVar1;
    if (len == 0) {
      return;
    }
  }
  __n = (size_t)len;
  sVar1 = 0;
  if (len != -1) {
    sVar1 = (long)(len + 1) - __n;
  }
  __dest.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
  super__Head_base<0UL,_char_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>)operator_new__((long)(len + 1));
  local_38._M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
  super__Head_base<0UL,_char_*,_false>._M_head_impl =
       (tuple<char_*,_std::default_delete<char[]>_>)
       (tuple<char_*,_std::default_delete<char[]>_>)
       __dest.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
       super__Head_base<0UL,_char_*,_false>._M_head_impl;
  memset((char *)((long)__dest.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                        super__Head_base<0UL,_char_*,_false>._M_head_impl + __n),0,sVar1);
  memcpy((void *)__dest.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                 super__Head_base<0UL,_char_*,_false>._M_head_impl,str,__n);
  *(char *)((long)__dest.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                  super__Head_base<0UL,_char_*,_false>._M_head_impl + __n) = '\0';
  pt->str = (char *)__dest.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                    super__Head_base<0UL,_char_*,_false>._M_head_impl;
  std::
  vector<std::unique_ptr<char[],std::default_delete<char[]>>,std::allocator<std::unique_ptr<char[],std::default_delete<char[]>>>>
  ::emplace_back<std::unique_ptr<char[],std::default_delete<char[]>>>
            ((vector<std::unique_ptr<char[],std::default_delete<char[]>>,std::allocator<std::unique_ptr<char[],std::default_delete<char[]>>>>
              *)&this->Variables,(unique_ptr<char[],_std::default_delete<char[]>_> *)&local_38);
  if (local_38._M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
      super__Head_base<0UL,_char_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>)0x0) {
    operator_delete__((void *)local_38._M_t.
                              super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                              super__Head_base<0UL,_char_*,_false>._M_head_impl);
  }
  return;
}

Assistant:

void cmCommandArgumentParserHelper::AllocateParserType(
  cmCommandArgumentParserHelper::ParserType* pt, const char* str, int len)
{
  pt->str = nullptr;
  if (len == 0) {
    len = static_cast<int>(strlen(str));
  }
  if (len == 0) {
    return;
  }
  auto out = cm::make_unique<char[]>(len + 1);
  memcpy(out.get(), str, len);
  out.get()[len] = 0;
  pt->str = out.get();
  this->Variables.push_back(std::move(out));
}